

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hpke.cc
# Opt level: O0

int p256_init_key(EVP_HPKE_KEY *key,uint8_t *priv_key,size_t priv_key_len)

{
  int iVar1;
  size_t priv_key_len_local;
  uint8_t *priv_key_local;
  EVP_HPKE_KEY *key_local;
  
  if (priv_key_len == 0x20) {
    iVar1 = p256_public_from_private(key->public_key,priv_key);
    if (iVar1 == 0) {
      key_local._4_4_ = 0;
    }
    else {
      OPENSSL_memcpy(key->private_key,priv_key,0x20);
      key_local._4_4_ = 1;
    }
  }
  else {
    ERR_put_error(6,0,0x66,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/hpke/hpke.cc"
                  ,0x160);
    key_local._4_4_ = 0;
  }
  return key_local._4_4_;
}

Assistant:

static int p256_init_key(EVP_HPKE_KEY *key, const uint8_t *priv_key,
                         size_t priv_key_len) {
  if (priv_key_len != P256_PRIVATE_KEY_LEN) {
    OPENSSL_PUT_ERROR(EVP, EVP_R_DECODE_ERROR);
    return 0;
  }

  if (!p256_public_from_private(key->public_key, priv_key)) {
    return 0;
  }

  OPENSSL_memcpy(key->private_key, priv_key, priv_key_len);
  return 1;
}